

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timerTest.cpp
# Opt level: O2

void __thiscall TestClass::handlePeriodic(TestClass *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  timeval curTime;
  timeval local_20;
  
  TimeUtils::getCurTime(&local_20);
  uVar1 = this->mPeriodElapsed;
  uVar2 = this->mPeriodCount;
  this->mPeriodElapsed =
       ((int)local_20.tv_sec - (int)(this->mLastTime).tv_sec) * 1000 +
       (int)((local_20.tv_usec - (this->mLastTime).tv_usec) / 1000) + uVar1;
  this->mPeriodCount = uVar2 + 1;
  (this->mLastTime).tv_sec = CONCAT44(local_20.tv_sec._4_4_,(int)local_20.tv_sec);
  (this->mLastTime).tv_usec = local_20.tv_usec;
  return;
}

Assistant:

void TestClass::handlePeriodic()
{
	TRACE_BEGIN( LOG_LVL_INFO );
	
	struct timeval curTime;
	TimeUtils::getCurTime( &curTime );
	
	int elapsed = TimeUtils::getDifference( &curTime, &mLastTime );
	mPeriodElapsed += elapsed;
	mPeriodCount++;
	LOG_NOTICE( "Periodic elapsed is %d, total periodic is %d, total elapsed is %d\n",
				elapsed, mPeriodCount, mPeriodElapsed );
	mLastTime = curTime;
}